

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_siginfo_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++:237:29),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_siginfo_t,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:237:29),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<siginfo_t> depResult;
  ExceptionOr<kj::_::Void> local_618;
  NullableValue<kj::Exception> local_4b0;
  char local_350;
  siginfo_t local_348;
  Exception local_2c8;
  Exception local_168;
  
  local_4b0.isSet = false;
  local_350 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_4b0);
  if (local_4b0.isSet == true) {
    Exception::Exception(&local_2c8,&local_4b0.field_1.value);
    local_168.ownFile.content.ptr = local_2c8.ownFile.content.ptr;
    local_168.ownFile.content.size_ = local_2c8.ownFile.content.size_;
    local_168.ownFile.content.disposer = local_2c8.ownFile.content.disposer;
    local_2c8.ownFile.content.ptr = (char *)0x0;
    local_2c8.ownFile.content.size_ = 0;
    local_168.file = local_2c8.file;
    local_168.line = local_2c8.line;
    local_168.type = local_2c8.type;
    local_168.description.content.ptr = local_2c8.description.content.ptr;
    local_168.description.content.size_ = local_2c8.description.content.size_;
    local_2c8.description.content.ptr = (char *)0x0;
    local_2c8.description.content.size_ = 0;
    local_168.description.content.disposer = local_2c8.description.content.disposer;
    local_168.context.ptr.disposer = local_2c8.context.ptr.disposer;
    local_168.context.ptr.ptr = local_2c8.context.ptr.ptr;
    local_2c8.context.ptr.ptr = (Context *)0x0;
    memcpy(local_168.trace,local_2c8.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_618,&local_168);
    local_618.value.ptr.isSet = false;
    Exception::~Exception(&local_168);
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_618);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_618);
    Exception::~Exception(&local_2c8);
  }
  else if (local_350 == '\x01') {
    anon_class_8_1_65f26276_for_func::operator()(&this->func,&local_348);
    local_618.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_618.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_618);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_618);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_4b0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }